

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::disconnect(CommonCore *this)

{
  BrokerBase *this_00;
  GlobalFederateId federateID;
  pointer pcVar1;
  size_type sVar2;
  string_view message;
  string_view message_00;
  bool bVar3;
  string *__rhs;
  ostream *poVar4;
  int iVar5;
  ulong uVar6;
  string_view name;
  string_view name_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ActionMessage udisconnect;
  
  ActionMessage::ActionMessage(&udisconnect,cmd_user_disconnect);
  this_00 = &this->super_BrokerBase;
  BrokerBase::addActionMessage(this_00,&udisconnect);
  iVar5 = -1;
  uVar6 = 1;
  do {
    bVar3 = waitForDisconnect(this,(milliseconds)0xc8);
    if (bVar3) {
LAB_00250f5c:
      ActionMessage::~ActionMessage(&udisconnect);
      return;
    }
    federateID.gid = (this->super_BrokerBase).global_id._M_i.gid;
    pcVar1 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    sVar2 = (this->super_BrokerBase).identifier._M_string_length;
    __rhs = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
    std::operator+(&local_108,"waiting on disconnect: current state=",__rhs);
    message._M_str = local_108._M_dataplus._M_p;
    message._M_len = local_108._M_string_length;
    name._M_str = pcVar1;
    name._M_len = sVar2;
    BrokerBase::sendToLogger(this_00,federateID,3,name,message,false);
    std::__cxx11::string::~string((string *)&local_108);
    if ((uVar6 & 3) == 0) {
      if (((this->super_BrokerBase).mainLoopIsRunning._M_base._M_i & 1U) == 0) {
        message_00._M_str =
             "main loop is stopped but have not received disconnect notice, assuming disconnected";
        message_00._M_len = 0x53;
        name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (this_00,(GlobalFederateId)(this->super_BrokerBase).global_id._M_i.gid,3,name_00,
                   message_00,false);
        goto LAB_00250f5c;
      }
      BrokerBase::addActionMessage(this_00,&udisconnect);
    }
    if ((int)(uVar6 / 0xd) * 0xd + iVar5 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"waiting on disconnect ");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    iVar5 = iVar5 + -1;
    uVar6 = (ulong)((int)uVar6 + 1);
  } while( true );
}

Assistant:

void CommonCore::disconnect()
{
    const ActionMessage udisconnect(CMD_USER_DISCONNECT);
    addActionMessage(udisconnect);
    int cnt{0};
    while (!waitForDisconnect(std::chrono::milliseconds(200))) {
        ++cnt;
        LOG_WARNING(global_id.load(),
                    getIdentifier(),
                    "waiting on disconnect: current state=" + brokerStateName(getBrokerState()));
        if (cnt % 4 == 0) {
            if (!isRunning()) {
                LOG_WARNING(
                    global_id.load(),
                    getIdentifier(),
                    "main loop is stopped but have not received disconnect notice, assuming disconnected");
                return;
            }
            addActionMessage(udisconnect);
        }
        if (cnt % 13 == 0) {
            std::cerr << "waiting on disconnect " << std::endl;
        }
    }
}